

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpptrace.cpp
# Opt level: O1

void cpptrace::print_frame
               (ostream *stream,bool color,uint frame_number_width,size_t counter,
               stacktrace_frame *frame)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  array<cpptrace::microfmt::detail::format_value,_2UL> args;
  array<cpptrace::microfmt::detail::format_value,_2UL> args_00;
  array<cpptrace::microfmt::detail::format_value,_3UL> args_01;
  array<cpptrace::microfmt::detail::format_value,_3UL> args_02;
  array<cpptrace::microfmt::detail::format_value,_3UL> args_03;
  array<cpptrace::microfmt::detail::format_value,_3UL> args_04;
  string *psVar2;
  long lVar3;
  undefined7 in_register_00000031;
  undefined8 uVar4;
  undefined8 *puVar5;
  _Alloc_hider _Var6;
  undefined8 *puVar7;
  char *pcVar8;
  char *pcVar9;
  bool bVar10;
  byte bVar11;
  char *reset;
  char *blue;
  string line;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *args_3;
  size_type sVar12;
  undefined8 uVar13;
  char *pcVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  format_value in_stack_ffffffffffffff28;
  string local_b8;
  char *local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  string local_88;
  undefined1 local_68 [32];
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  char *local_38;
  undefined4 local_28;
  
  bVar11 = 0;
  local_98 = "\x1b[0m";
  bVar10 = (int)CONCAT71(in_register_00000031,color) == 0;
  if (bVar10) {
    local_98 = "";
  }
  pcVar9 = "\x1b[32m";
  if (bVar10) {
    pcVar9 = "";
  }
  pcVar8 = "\x1b[33m";
  if (bVar10) {
    pcVar8 = "";
  }
  local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x1957b6;
  if (bVar10) {
    local_90 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1949ba;
  }
  args_3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)CONCAT44(0,frame_number_width);
  local_68._16_4_ = 2;
  uStack_40 = 2;
  uVar13 = CONCAT44(local_68._20_4_,2);
  uVar16 = CONCAT44(uStack_3c,2);
  args._M_elems[0].field_0.string_view_value._M_str = (char *)local_68._8_8_;
  args._M_elems[0].field_0.c_string_value = (char *)args_3;
  args._M_elems[0]._16_8_ = uVar13;
  args._M_elems[1].field_0.string_view_value._M_len = counter;
  args._M_elems[1].field_0.string_view_value._M_str = (char *)local_48;
  args._M_elems[1]._16_8_ = uVar16;
  sVar12 = local_68._8_8_;
  pcVar14 = (char *)counter;
  uVar15 = local_48;
  local_68._0_8_ = args_3;
  local_68._24_8_ = counter;
  microfmt::detail::format<2ul,char_const*>(&local_88,(detail *)"#{<{}} ","",(char *)counter,args);
  if (frame->is_inline == true) {
    local_68._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x12;
    local_68._16_4_ = 2;
    local_68._24_8_ = "(inlined)";
    uStack_40 = 5;
    uVar13 = CONCAT44(local_68._20_4_,2);
    uVar16 = CONCAT44(uStack_3c,5);
    pcVar14 = "(inlined)";
    args_3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)0x12;
    args_00._M_elems[0].field_0.string_view_value._M_str = (char *)local_68._8_8_;
    args_00._M_elems[0].field_0.int64_value = 0x12;
    args_00._M_elems[0]._16_8_ = uVar13;
    args_00._M_elems[1].field_0.c_string_value = "(inlined)";
    args_00._M_elems[1].field_0.string_view_value._M_str = (char *)local_48;
    args_00._M_elems[1]._16_8_ = uVar16;
    microfmt::detail::format<2ul,char_const*>
              (&local_b8,(detail *)"{<{}}","",(char *)counter,args_00);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_88,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    uVar4 = local_b8.field_2._M_allocated_capacity;
    _Var6._M_p = local_b8._M_dataplus._M_p;
    sVar12 = local_68._8_8_;
    uVar15 = local_48;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) goto LAB_001320c4;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)0x10;
    microfmt::format<char_const*const&,unsigned_long,unsigned_long_const&,char_const*const&>
              ((string *)local_68,(microfmt *)"{}0x{>{}:0h}{}",(char *)&local_90,(char **)&local_b8,
               &frame->raw_address,(unsigned_long *)&local_98,
               (char **)&args_3->_M_allocated_capacity);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_88,(char *)local_68._0_8_,local_68._8_8_);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._0_8_ ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)(local_68 + 0x10)) goto LAB_001320c4;
    uVar4 = CONCAT44(local_68._20_4_,local_68._16_4_);
    _Var6._M_p = (pointer)local_68._0_8_;
  }
  operator_delete(_Var6._M_p,uVar4 + 1);
LAB_001320c4:
  if ((frame->symbol)._M_string_length != 0) {
    local_68._0_8_ = pcVar8;
    local_68._16_4_ = 5;
    local_68._24_8_ = &frame->symbol;
    uStack_40 = 3;
    local_38 = local_98;
    local_28 = 5;
    puVar5 = (undefined8 *)local_68;
    puVar7 = (undefined8 *)&stack0xfffffffffffffef8;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar11 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
    }
    args_01._M_elems[0].field_0.string_view_value._M_str = (char *)sVar12;
    args_01._M_elems[0].field_0.int64_value = (int64_t)args_3;
    args_01._M_elems[0]._16_8_ = uVar13;
    args_01._M_elems[1].field_0.c_string_value = pcVar14;
    args_01._M_elems[1].field_0.string_view_value._M_str = (char *)uVar15;
    args_01._M_elems[1]._16_8_ = uVar16;
    args_01._M_elems[2] = in_stack_ffffffffffffff28;
    microfmt::detail::format<3ul,char_const*>
              (&local_b8,(detail *)" in {}{}{}","",(char *)0x0,args_01);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_88,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
  }
  if ((frame->filename)._M_string_length != 0) {
    local_68._0_8_ = pcVar9;
    local_68._16_4_ = 5;
    local_68._24_8_ = &frame->filename;
    uStack_40 = 3;
    local_38 = local_98;
    local_28 = 5;
    puVar5 = (undefined8 *)local_68;
    puVar7 = (undefined8 *)&stack0xfffffffffffffef8;
    for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
      *puVar7 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar11 * -2 + 1;
      puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
    }
    args_02._M_elems[0].field_0.string_view_value._M_str = (char *)sVar12;
    args_02._M_elems[0].field_0.int64_value = (int64_t)args_3;
    args_02._M_elems[0]._16_8_ = uVar13;
    args_02._M_elems[1].field_0.c_string_value = pcVar14;
    args_02._M_elems[1].field_0.string_view_value._M_str = (char *)uVar15;
    args_02._M_elems[1]._16_8_ = uVar16;
    args_02._M_elems[2] = in_stack_ffffffffffffff28;
    microfmt::detail::format<3ul,char_const*>
              (&local_b8,(detail *)" at {}{}{}","",(char *)0x0,args_02);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
              (&local_88,local_b8._M_dataplus._M_p,local_b8._M_string_length);
    paVar1 = &local_b8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    psVar2 = (string *)(ulong)(frame->line).raw_value;
    if (psVar2 != (string *)0xffffffff) {
      local_68._0_8_ = local_90;
      local_68._16_4_ = 5;
      local_68._24_8_ = psVar2;
      uStack_40 = 2;
      local_38 = local_98;
      local_28 = 5;
      puVar5 = (undefined8 *)local_68;
      puVar7 = (undefined8 *)&stack0xfffffffffffffef8;
      for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
        *puVar7 = *puVar5;
        puVar5 = puVar5 + (ulong)bVar11 * -2 + 1;
        puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
      }
      args_03._M_elems[0].field_0.string_view_value._M_str = (char *)sVar12;
      args_03._M_elems[0].field_0.int64_value = (int64_t)args_3;
      args_03._M_elems[0]._16_8_ = uVar13;
      args_03._M_elems[1].field_0.c_string_value = pcVar14;
      args_03._M_elems[1].field_0.string_view_value._M_str = (char *)uVar15;
      args_03._M_elems[1]._16_8_ = uVar16;
      args_03._M_elems[2] = in_stack_ffffffffffffff28;
      microfmt::detail::format<3ul,char_const*>
                (&local_b8,(detail *)":{}{}{}","",(char *)0x0,args_03);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                (&local_88,local_b8._M_dataplus._M_p,local_b8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      psVar2 = (string *)(ulong)(frame->column).raw_value;
      if (psVar2 != (string *)0xffffffff) {
        local_68._0_8_ = local_90;
        local_68._16_4_ = 5;
        local_68._24_8_ = psVar2;
        uStack_40 = 2;
        local_38 = local_98;
        local_28 = 5;
        puVar5 = (undefined8 *)local_68;
        puVar7 = (undefined8 *)&stack0xfffffffffffffef8;
        for (lVar3 = 9; lVar3 != 0; lVar3 = lVar3 + -1) {
          *puVar7 = *puVar5;
          puVar5 = puVar5 + (ulong)bVar11 * -2 + 1;
          puVar7 = puVar7 + (ulong)bVar11 * -2 + 1;
        }
        args_04._M_elems[0].field_0.string_view_value._M_str = (char *)sVar12;
        args_04._M_elems[0].field_0.int64_value = (int64_t)args_3;
        args_04._M_elems[0]._16_8_ = uVar13;
        args_04._M_elems[1].field_0.c_string_value = pcVar14;
        args_04._M_elems[1].field_0.string_view_value._M_str = (char *)uVar15;
        args_04._M_elems[1]._16_8_ = uVar16;
        args_04._M_elems[2] = in_stack_ffffffffffffff28;
        microfmt::detail::format<3ul,char_const*>
                  (&local_b8,(detail *)":{}{}{}","",(char *)0x0,args_04);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_88,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != paVar1) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
      }
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (stream,local_88._M_dataplus._M_p,local_88._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void print_frame(
        std::ostream& stream,
        bool color,
        unsigned frame_number_width,
        std::size_t counter,
        const stacktrace_frame& frame
    ) {
        const auto reset   = color ? RESET : "";
        const auto green   = color ? GREEN : "";
        const auto yellow  = color ? YELLOW : "";
        const auto blue    = color ? BLUE : "";
        std::string line = microfmt::format("#{<{}} ", frame_number_width, counter);
        if(frame.is_inline) {
            line += microfmt::format("{<{}}", 2 * sizeof(frame_ptr) + 2, "(inlined)");
        } else {
            line += microfmt::format("{}0x{>{}:0h}{}", blue, 2 * sizeof(frame_ptr), frame.raw_address, reset);
        }
        if(!frame.symbol.empty()) {
            line += microfmt::format(" in {}{}{}", yellow, frame.symbol, reset);
        }
        if(!frame.filename.empty()) {
            line += microfmt::format(" at {}{}{}", green, frame.filename, reset);
            if(frame.line.has_value()) {
                line += microfmt::format(":{}{}{}", blue, frame.line.value(), reset);
                if(frame.column.has_value()) {
                    line += microfmt::format(":{}{}{}", blue, frame.column.value(), reset);
                }
            }
        }
        stream << line;
    }